

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::flash_bulk_erase(Spi *this)

{
  uint8_t local_11;
  Spi *pSStack_10;
  uint8_t data [1];
  Spi *this_local;
  
  pSStack_10 = this;
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"bulk erase..\n");
  }
  local_11 = 199;
  flash_chip_select(this);
  xfer_spi(this,&local_11,1);
  flash_chip_deselect(this);
  return;
}

Assistant:

void Spi::flash_bulk_erase() {
	if (verbose)
		fprintf(stdout, "bulk erase..\n");

	uint8_t data[1] = { FC_CE };
	flash_chip_select();
	xfer_spi(data, 1);
	flash_chip_deselect();
}